

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O2

void wasm::ReReloop::BreakTask::handle(ReReloop *parent,Break *curr)

{
  Block *this;
  Expression *pEVar1;
  Block *after;
  Block *pBVar2;
  
  this = parent->currCFGBlock;
  pBVar2 = getBreakTarget(parent,(Name)(curr->name).super_IString.str);
  CFG::Block::AddBranchTo(this,pBVar2,curr->condition,(Expression *)0x0);
  pEVar1 = curr->condition;
  pBVar2 = startCFGBlock(parent);
  if (pEVar1 != (Expression *)0x0) {
    CFG::Block::AddBranchTo(this,pBVar2,(Expression *)0x0,(Expression *)0x0);
    return;
  }
  return;
}

Assistant:

static void handle(ReReloop& parent, Break* curr) {
      // add the branch. note how if the condition is false, it is the right
      // value there as well
      auto* before = parent.getCurrCFGBlock();
      parent.addBranch(
        before, parent.getBreakTarget(curr->name), curr->condition);
      if (curr->condition) {
        auto* after = parent.startCFGBlock();
        parent.addBranch(before, after);
      } else {
        parent.stopControlFlow();
      }
    }